

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O0

void TestEq<char,int>(char expval,int val,char *exp,char *file,int line,char *func)

{
  type_conflict t;
  type_conflict4 t_00;
  char *expval_00;
  char *val_00;
  string local_70;
  string local_50;
  char *local_30;
  char *func_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  char *exp_local;
  int val_local;
  char expval_local;
  
  if (expval != val) {
    local_30 = func;
    func_local._4_4_ = line;
    pcStack_20 = file;
    file_local = exp;
    exp_local._0_4_ = val;
    exp_local._7_1_ = expval;
    t = scalar_as_underlying<char>(expval);
    flatbuffers::NumToString<char>(&local_50,t);
    expval_00 = (char *)std::__cxx11::string::c_str();
    t_00 = scalar_as_underlying<int>((int)exp_local);
    flatbuffers::NumToString<int>(&local_70,t_00);
    val_00 = (char *)std::__cxx11::string::c_str();
    TestFail(expval_00,val_00,file_local,pcStack_20,func_local._4_4_,local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}